

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O1

ptrlen BinarySource_get_pstring(BinarySource *src)

{
  size_t sVar1;
  byte bVar2;
  size_t sVar3;
  ptrlen pVar4;
  
  if (src->err == BSE_NO_ERROR) {
    if (src->len != src->pos) {
      sVar3 = src->pos;
      sVar1 = sVar3 + 1;
      src->pos = sVar1;
      if (src->err != BSE_NO_ERROR) goto LAB_00135a31;
      bVar2 = *(byte *)((long)src->data + sVar3);
      if ((ulong)bVar2 <= src->len - sVar1) {
        src->pos = sVar1 + bVar2;
        pVar4.len._0_1_ = bVar2;
        pVar4.ptr = (void *)((long)src->data + sVar1);
        pVar4.len._1_7_ = 0;
        return pVar4;
      }
    }
    src->err = BSE_OUT_OF_DATA;
  }
LAB_00135a31:
  return (ptrlen)ZEXT816(0x13d92f);
}

Assistant:

ptrlen BinarySource_get_pstring(BinarySource *src)
{
    const unsigned char *ucp;
    size_t len;

    if (!avail(1))
        return make_ptrlen("", 0);

    ucp = consume(1);
    len = *ucp;

    if (!avail(len))
        return make_ptrlen("", 0);

    return make_ptrlen(consume(len), len);
}